

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcMove,_3UL>::Construct
                   (DB *db,LIST *params)

{
  IfcMove *in;
  
  in = (IfcMove *)operator_new(0x1e8);
  *(undefined ***)&in->field_0x1d0 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0x1d8 = 0;
  *(char **)&in->field_0x1e0 = "IfcMove";
  Assimp::IFC::Schema_2x3::IfcTask::IfcTask((IfcTask *)in,&PTR_construction_vtable_24__008b9e98);
  *(undefined8 *)&(in->super_IfcTask).field_0x198 = 0;
  *(undefined ***)&in->super_IfcTask = &PTR__IfcMove_008b9d90;
  *(undefined ***)&in->field_0x1d0 = &PTR__IfcMove_008b9e80;
  *(undefined ***)&(in->super_IfcTask).field_0x88 = &PTR__IfcMove_008b9db8;
  *(undefined ***)&(in->super_IfcTask).field_0x98 = &PTR__IfcMove_008b9de0;
  *(undefined ***)&(in->super_IfcTask).field_0xd0 = &PTR__IfcMove_008b9e08;
  (in->super_IfcTask).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTask,_5UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcMove_008b9e30;
  *(undefined ***)&(in->super_IfcTask).field_0x190 = &PTR__IfcMove_008b9e58;
  *(undefined8 *)&(in->super_IfcTask).field_0x1a0 = 0;
  (in->MoveTo).obj = (LazyObject *)0x0;
  (in->PunchList).ptr.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in->PunchList).ptr.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(in->PunchList).ptr.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(in->PunchList).ptr.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcMove>(db,params,in);
  return (Object *)(&(in->super_IfcTask).field_0x0 + *(long *)(*(long *)&in->super_IfcTask + -0x18))
  ;
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }